

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnFunction
          (BinaryReaderInterp *this,Index index,Index sig_index)

{
  ModuleDesc *pMVar1;
  Index index_00;
  bool bVar2;
  value_type local_130;
  reference local_b8;
  FuncType *func_type;
  Var local_90;
  Location local_48;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index sig_index_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  local_20 = sig_index;
  local_1c = index;
  _sig_index_local = this;
  GetLocation(&local_48,this);
  index_00 = local_20;
  GetLocation((Location *)&func_type,this);
  Var::Var(&local_90,index_00,(Location *)&func_type);
  local_24 = (Enum)SharedValidator::OnFunction(&this->validator_,&local_48,&local_90);
  bVar2 = Failed((Result)local_24);
  Var::~Var(&local_90);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_b8 = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
               operator[](&this->module_->func_types,(ulong)local_20);
    pMVar1 = this->module_;
    FuncType::FuncType(&local_130.type,local_b8);
    memset(&local_130.locals,0,0x18);
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
              (&local_130.locals);
    local_130.code_offset = 0xffffffff;
    memset(&local_130.handlers,0,0x18);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              (&local_130.handlers);
    std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::push_back
              (&pMVar1->funcs,&local_130);
    FuncDesc::~FuncDesc(&local_130);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,local_b8);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnFunction(Index index, Index sig_index) {
  CHECK_RESULT(
      validator_.OnFunction(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  module_.funcs.push_back(FuncDesc{func_type, {}, Istream::kInvalidOffset, {}});
  func_types_.push_back(func_type);
  return Result::Ok;
}